

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_seek_frame(stb_vorbis *f,uint sample_number)

{
  int iVar1;
  int iVar2;
  uint in_ESI;
  vorb *in_RDI;
  int frame_samples;
  int mode;
  int right_end;
  int right_start;
  int left_end;
  int left_start;
  uint32 max_frame_samples;
  uint32 in_stack_00000034;
  stb_vorbis *in_stack_00000038;
  vorb *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->push_mode == '\0') {
    iVar1 = seek_to_sample_coarse(in_stack_00000038,in_stack_00000034);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = in_RDI->blocksize_1 * 3 - in_RDI->blocksize_0 >> 2;
      while (in_RDI->current_loc < in_ESI) {
        iVar2 = peek_decode_initial((vorb *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),(int *)in_RDI,
                                    (int *)CONCAT44(in_ESI,iVar1),
                                    (int *)CONCAT44(in_stack_ffffffffffffffe4,
                                                    in_stack_ffffffffffffffe0),
                                    (int *)CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),
                                    (int *)CONCAT44(in_stack_ffffffffffffffd4,
                                                    in_stack_ffffffffffffffd0));
        if (iVar2 == 0) {
          iVar1 = error(in_RDI,VORBIS_seek_failed);
          return iVar1;
        }
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffdc - in_stack_ffffffffffffffe4;
        if (in_ESI < in_RDI->current_loc + in_stack_ffffffffffffffd0) {
          return 1;
        }
        if (in_ESI < in_RDI->current_loc + in_stack_ffffffffffffffd0 + iVar1) {
          vorbis_pump_first_frame
                    ((stb_vorbis *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
        else {
          in_RDI->current_loc = in_stack_ffffffffffffffd0 + in_RDI->current_loc;
          in_RDI->previous_length = 0;
          maybe_start_packet(in_stack_ffffffffffffffc8);
          flush_packet((vorb *)0x20b0ee);
        }
      }
      if (in_RDI->current_loc == in_ESI) {
        iVar1 = 1;
      }
      else {
        iVar1 = error(in_RDI,VORBIS_seek_failed);
      }
    }
  }
  else {
    iVar1 = error(in_RDI,VORBIS_invalid_api_mixing);
  }
  return iVar1;
}

Assistant:

int stb_vorbis_seek_frame(stb_vorbis *f, unsigned int sample_number)
{
   uint32 max_frame_samples;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   // fast page-level search
   if (!seek_to_sample_coarse(f, sample_number))
      return 0;

   assert(f->current_loc_valid);
   assert(f->current_loc <= sample_number);

   // linear search for the relevant packet
   max_frame_samples = (f->blocksize_1*3 - f->blocksize_0) >> 2;
   while (f->current_loc < sample_number) {
      int left_start, left_end, right_start, right_end, mode, frame_samples;
      if (!peek_decode_initial(f, &left_start, &left_end, &right_start, &right_end, &mode))
         return error(f, VORBIS_seek_failed);
      // calculate the number of samples returned by the next frame
      frame_samples = right_start - left_start;
      if (f->current_loc + frame_samples > sample_number) {
         return 1; // the next frame will contain the sample
      } else if (f->current_loc + frame_samples + max_frame_samples > sample_number) {
         // there's a chance the frame after this could contain the sample
         vorbis_pump_first_frame(f);
      } else {
         // this frame is too early to be relevant
         f->current_loc += frame_samples;
         f->previous_length = 0;
         maybe_start_packet(f);
         flush_packet(f);
      }
   }
   // the next frame should start with the sample
   if (f->current_loc != sample_number) return error(f, VORBIS_seek_failed);
   return 1;
}